

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv_os_getenv(char *name,char *buffer,size_t *size)

{
  char *__s;
  size_t sVar1;
  size_t len;
  char *var;
  size_t *size_local;
  char *buffer_local;
  char *name_local;
  
  if ((((name == (char *)0x0) || (buffer == (char *)0x0)) || (size == (size_t *)0x0)) ||
     (*size == 0)) {
    name_local._4_4_ = -0x16;
  }
  else {
    __s = getenv(name);
    if (__s == (char *)0x0) {
      name_local._4_4_ = -2;
    }
    else {
      sVar1 = strlen(__s);
      if (sVar1 < *size) {
        memcpy(buffer,__s,sVar1 + 1);
        *size = sVar1;
        name_local._4_4_ = 0;
      }
      else {
        *size = sVar1 + 1;
        name_local._4_4_ = -0x69;
      }
    }
  }
  return name_local._4_4_;
}

Assistant:

int uv_os_getenv(const char* name, char* buffer, size_t* size) {
  char* var;
  size_t len;

  if (name == NULL || buffer == NULL || size == NULL || *size == 0)
    return -EINVAL;

  var = getenv(name);

  if (var == NULL)
    return -ENOENT;

  len = strlen(var);

  if (len >= *size) {
    *size = len + 1;
    return -ENOBUFS;
  }

  memcpy(buffer, var, len + 1);
  *size = len;

  return 0;
}